

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O2

bool xatlas::internal::Fit::computeLeastSquaresNormal
               (Vector3 *points,uint32_t pointsCount,Vector3 *normal)

{
  undefined8 uVar1;
  long lVar2;
  ulong uVar3;
  bool bVar4;
  float fVar5;
  float extraout_XMM0_Dc;
  float extraout_XMM0_Dd;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  Vector3 VVar24;
  Vector3 local_98;
  float local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  Vector3 local_40;
  Vector3 local_30;
  
  if (pointsCount < 3) {
    __assert_fail("pointsCount >= 3",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                  ,0x66c,
                  "static bool xatlas::internal::Fit::computeLeastSquaresNormal(const Vector3 *, uint32_t, Vector3 *)"
                 );
  }
  if (pointsCount == 3) {
    local_30 = operator-(points + 2,points);
    local_40 = operator-(points + 1,points);
    local_98 = cross(&local_30,&local_40);
    VVar24 = normalize(&local_98,local_98.x);
    *normal = VVar24;
    bVar4 = true;
  }
  else {
    uVar3 = (ulong)pointsCount;
    fVar6 = 0.0;
    fVar7 = 0.0;
    fVar5 = 0.0;
    for (lVar2 = 0; uVar3 * 0xc - lVar2 != 0; lVar2 = lVar2 + 0xc) {
      uVar1 = *(undefined8 *)((long)&points->x + lVar2);
      fVar6 = fVar6 + (float)uVar1;
      fVar7 = fVar7 + (float)((ulong)uVar1 >> 0x20);
      fVar5 = fVar5 + *(float *)((long)&points->z + lVar2);
    }
    fVar9 = 1.0 / (float)uVar3;
    local_98.y = fVar9 * fVar7;
    local_98.x = fVar9 * fVar6;
    local_98.z = fVar9 * fVar5;
    fVar5 = 0.0;
    fVar6 = 0.0;
    fVar7 = 0.0;
    fVar9 = 0.0;
    fVar20 = 0.0;
    fVar12 = 0.0;
    fVar16 = 0.0;
    fVar17 = 0.0;
    fVar18 = 0.0;
    fVar19 = 0.0;
    uVar13 = 0;
    uVar14 = 0;
    uVar15 = 0;
    uVar21 = 0;
    uVar22 = 0;
    uVar23 = 0;
    while (bVar4 = uVar3 != 0, uVar3 = uVar3 - 1, bVar4) {
      local_88 = fVar20;
      uStack_84 = uVar21;
      uStack_80 = uVar22;
      uStack_7c = uVar23;
      local_78 = fVar16;
      fStack_74 = fVar17;
      fStack_70 = fVar18;
      fStack_6c = fVar19;
      local_68 = fVar12;
      uStack_64 = uVar13;
      uStack_60 = uVar14;
      uStack_5c = uVar15;
      local_58 = fVar5;
      fStack_54 = fVar6;
      fStack_50 = fVar7;
      fStack_4c = fVar9;
      VVar24 = operator-(points,&local_98);
      fVar20 = VVar24.z;
      fVar5 = VVar24.x;
      fVar6 = VVar24.y;
      fVar12 = local_68 + fVar6 * fVar5;
      fVar16 = local_78 + fVar5 * fVar5;
      fVar17 = fStack_74 + fVar6 * fVar6;
      fVar18 = fStack_70 + extraout_XMM0_Dc * extraout_XMM0_Dc;
      fVar19 = fStack_6c + extraout_XMM0_Dd * extraout_XMM0_Dd;
      fVar5 = local_58 + fVar20 * fVar5;
      fVar6 = fStack_54 + fVar20 * fVar6;
      fVar7 = fStack_50 + fVar20 * extraout_XMM0_Dc;
      fVar9 = fStack_4c + fVar20 * extraout_XMM0_Dd;
      fVar20 = local_88 + fVar20 * fVar20;
      points = points + 1;
      uVar13 = uStack_64;
      uVar14 = uStack_60;
      uVar15 = uStack_5c;
      uVar21 = uStack_84;
      uVar22 = uStack_80;
      uVar23 = uStack_7c;
    }
    fVar19 = -fVar6;
    fVar8 = -fVar5;
    fVar18 = fVar17 * fVar20 + fVar6 * fVar19;
    fVar10 = fVar16 * fVar20 + fVar5 * fVar8;
    fVar9 = fVar16 * fVar17 - fVar12 * fVar12;
    fVar7 = fVar10;
    if (fVar10 <= fVar9) {
      fVar7 = fVar9;
    }
    fVar11 = fVar18;
    if (fVar18 <= fVar7) {
      fVar11 = fVar7;
    }
    if (0.0 < fVar11) {
      if ((fVar11 != fVar18) || (NAN(fVar11) || NAN(fVar18))) {
        if ((fVar11 != fVar10) || (NAN(fVar11) || NAN(fVar10))) {
          if ((fVar11 != fVar9) || (NAN(fVar11) || NAN(fVar9))) {
            fVar10 = 0.0;
            fVar18 = 0.0;
            fVar9 = 0.0;
          }
          else {
            fVar10 = fVar12 * fVar5 + fVar16 * fVar19;
            fVar18 = fVar12 * fVar6 + fVar17 * fVar8;
          }
        }
        else {
          fVar18 = fVar6 * fVar5 + fVar20 * -fVar12;
          fVar9 = fVar12 * fVar5 + fVar16 * fVar19;
        }
      }
      else {
        fVar10 = fVar5 * fVar6 + fVar20 * -fVar12;
        fVar9 = fVar12 * fVar6 + fVar17 * fVar8;
      }
      fVar5 = SQRT(fVar9 * fVar9 + fVar18 * fVar18 + fVar10 * fVar10);
      if (0.0001 < ABS(fVar5)) {
        fVar5 = 1.0 / fVar5;
        normal->x = fVar18 * fVar5;
        normal->y = fVar10 * fVar5;
        normal->z = fVar9 * fVar5;
        bVar4 = isNormalized(normal,fVar9 * fVar5);
        return bVar4;
      }
    }
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

static bool computeLeastSquaresNormal(const Vector3 *points, uint32_t pointsCount, Vector3 *normal)
	{
		XA_DEBUG_ASSERT(pointsCount >= 3);
		if (pointsCount == 3) {
			*normal = normalize(cross(points[2] - points[0], points[1] - points[0]), kEpsilon);
			return true;
		}
		const float invN = 1.0f / float(pointsCount);
		Vector3 centroid(0.0f);
		for (uint32_t i = 0; i < pointsCount; i++)
			centroid += points[i];
		centroid *= invN;
		// Calculate full 3x3 covariance matrix, excluding symmetries:
		float xx = 0.0f, xy = 0.0f, xz = 0.0f, yy = 0.0f, yz = 0.0f, zz = 0.0f;
		for (uint32_t i = 0; i < pointsCount; i++) {
			Vector3 r = points[i] - centroid;
			xx += r.x * r.x;
			xy += r.x * r.y;
			xz += r.x * r.z;
			yy += r.y * r.y;
			yz += r.y * r.z;
			zz += r.z * r.z;
		}
#if 0
		xx *= invN;
		xy *= invN;
		xz *= invN;
		yy *= invN;
		yz *= invN;
		zz *= invN;
		Vector3 weighted_dir(0.0f);
		{
			float det_x = yy * zz - yz * yz;
			const Vector3 axis_dir(det_x, xz * yz - xy * zz, xy * yz - xz * yy);
			float weight = det_x * det_x;
			if (dot(weighted_dir, axis_dir) < 0.0f)
				weight = -weight;
			weighted_dir += axis_dir * weight;
		}
		{
			float det_y = xx * zz - xz * xz;
			const Vector3 axis_dir(xz * yz - xy * zz, det_y, xy * xz - yz * xx);
			float weight = det_y * det_y;
			if (dot(weighted_dir, axis_dir) < 0.0f)
				weight = -weight;
			weighted_dir += axis_dir * weight;
		}
		{
			float det_z = xx * yy - xy * xy;
			const Vector3 axis_dir(xy * yz - xz * yy, xy * xz - yz * xx, det_z);
			float weight = det_z * det_z;
			if (dot(weighted_dir, axis_dir) < 0.0f)
				weight = -weight;
			weighted_dir += axis_dir * weight;
		}
		*normal = normalize(weighted_dir, kEpsilon);
#else
		const float det_x = yy * zz - yz * yz;
		const float det_y = xx * zz - xz * xz;
		const float det_z = xx * yy - xy * xy;
		const float det_max = max(det_x, max(det_y, det_z));
		if (det_max <= 0.0f)
			return false; // The points don't span a plane
		// Pick path with best conditioning:
		Vector3 dir(0.0f);
		if (det_max == det_x)
			dir = Vector3(det_x,xz * yz - xy * zz,xy * yz - xz * yy);
		else if (det_max == det_y)
			dir = Vector3(xz * yz - xy * zz, det_y, xy * xz - yz * xx);
		else if (det_max == det_z)
			dir = Vector3(xy * yz - xz * yy, xy * xz - yz * xx, det_z);
		const float len = length(dir);
		if (isZero(len, kEpsilon))
			return false;
		*normal = dir * (1.0f / len);
#endif
		return isNormalized(*normal);
	}